

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OutputStream.cpp
# Opt level: O2

int __thiscall cali::OutputStream::OutputStreamImpl::init(OutputStreamImpl *this,EVP_PKEY_CTX *ctx)

{
  path *__p;
  char cVar1;
  int in_EAX;
  ostream *poVar2;
  basic_ostream<char,_std::char_traits<char>_> *pbVar3;
  openmode __mode;
  path parent;
  Log local_230;
  
  if (this->is_initialized == false) {
    std::mutex::lock(&this->init_mutex);
    this->is_initialized = true;
    if (this->type == File) {
      __p = &this->filename;
      std::filesystem::__cxx11::path::parent_path();
      if (parent._M_pathname._M_string_length != 0) {
        cVar1 = std::filesystem::create_directories(&parent);
        if (cVar1 != '\0') {
          std::ofstream::ofstream(&local_230);
          local_230.m_level = 2;
          poVar2 = Log::stream(&local_230);
          poVar2 = std::operator<<(poVar2,"OutputStream: created directories for ");
          pbVar3 = std::filesystem::__cxx11::operator<<(poVar2,__p);
          std::endl<char,std::char_traits<char>>(pbVar3);
          std::ofstream::~ofstream(&local_230);
        }
      }
      std::filesystem::__cxx11::path::~path(&parent);
      __mode = _S_trunc;
      if (this->mode == Append) {
        __mode = _S_app;
      }
      std::basic_ofstream<char,_std::char_traits<char>_>::open<std::filesystem::__cxx11::path>
                (&this->fs,__p,__mode);
      cVar1 = std::__basic_file<char>::is_open();
      if (cVar1 == '\0') {
        this->type = None;
        std::ofstream::ofstream(&local_230);
        local_230.m_level = 0;
        poVar2 = Log::stream(&local_230);
        poVar2 = std::operator<<(poVar2,"Could not open output stream ");
        pbVar3 = std::filesystem::__cxx11::operator<<(poVar2,__p);
        std::endl<char,std::char_traits<char>>(pbVar3);
        std::ofstream::~ofstream(&local_230);
      }
    }
    in_EAX = pthread_mutex_unlock((pthread_mutex_t *)&this->init_mutex);
  }
  return in_EAX;
}

Assistant:

void init()
    {
        if (is_initialized)
            return;

        std::lock_guard<std::mutex> g(init_mutex);

        is_initialized = true;

        if (type == StreamType::File) {
            check_and_create_directory(filename);
            fs.open(filename, mode == Mode::Append ? std::ios::app : std::ios::trunc);

            if (!fs.is_open()) {
                type = StreamType::None;

                Log(0).stream() << "Could not open output stream " << filename << std::endl;
            }
        }
    }